

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

void Abc_SclInsertBarBufs(Abc_Ntk_t *pNtk,Vec_Int_t *vBufs)

{
  int i_00;
  Abc_Obj_t *pAVar1;
  int i;
  int i_01;
  
  for (i_01 = 0; i_01 < vBufs->nSize; i_01 = i_01 + 1) {
    i_00 = Vec_IntEntry(vBufs,i_01);
    pAVar1 = Abc_NtkObj(pNtk,i_00);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      (pAVar1->field_5).pData = (void *)0x0;
    }
  }
  return;
}

Assistant:

void Abc_SclInsertBarBufs( Abc_Ntk_t * pNtk, Vec_Int_t * vBufs )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachObjVec( vBufs, pNtk, pObj, i )
        pObj->pData = NULL;
}